

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_surface_mesh.cpp
# Opt level: O2

VertexData<Vertex> * __thiscall
geometrycentral::surface::ManifoldSurfaceMesh::separateNonmanifoldVertices
          (VertexData<Vertex> *__return_storage_ptr__,ManifoldSurfaceMesh *this)

{
  Vertex *pVVar1;
  size_t i;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> local_58;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> local_40;
  RangeSetBase<geometrycentral::surface::VertexRangeF> local_28;
  
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
            (__return_storage_ptr__,&this->super_SurfaceMesh);
  local_28.iEnd = (this->super_SurfaceMesh).nVerticesFillCount;
  local_28.iStart = 0;
  local_28.mesh = &this->super_SurfaceMesh;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin(&local_58,&local_28);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end(&local_40,&local_28);
  while (local_58.iCurr != local_40.iCurr) {
    pVVar1 = (__return_storage_ptr__->data).
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
             .m_storage.m_data;
    pVVar1[local_58.iCurr].
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         local_58.mesh;
    pVVar1[local_58.iCurr].
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         local_58.iCurr;
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

VertexData<Vertex> ManifoldSurfaceMesh::separateNonmanifoldVertices() {
  VertexData<Vertex> parents(*this);
  for (Vertex v : vertices()) parents[v] = v;
  return parents;
}